

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

Symbol * __thiscall slang::ast::Compilation::getDefaultClocking(Compilation *this,Scope *scope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  Symbol *pSVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  
  do {
    pSVar8 = Scope::getContainingInstanceOrChecker(scope);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pSVar8;
    uVar11 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar11 >> ((byte)(this->defaultClockingMap).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
                             .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar11 & 0xff];
    ppVar3 = (this->defaultClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.elements_;
    uVar4 = (this->defaultClockingMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
            .arrays.groups_size_mask;
    uVar12 = 0;
    do {
      pgVar1 = (this->defaultClockingMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_ + uVar9;
      bVar7 = pgVar1->m[0xf].n;
      uVar14 = (uchar)uVar2;
      auVar18[0] = -(pgVar1->m[0].n == uVar14);
      uVar15 = (uchar)((uint)uVar2 >> 8);
      auVar18[1] = -(pgVar1->m[1].n == uVar15);
      uVar16 = (uchar)((uint)uVar2 >> 0x10);
      auVar18[2] = -(pgVar1->m[2].n == uVar16);
      bVar17 = (byte)((uint)uVar2 >> 0x18);
      auVar18[3] = -(pgVar1->m[3].n == bVar17);
      auVar18[4] = -(pgVar1->m[4].n == uVar14);
      auVar18[5] = -(pgVar1->m[5].n == uVar15);
      auVar18[6] = -(pgVar1->m[6].n == uVar16);
      auVar18[7] = -(pgVar1->m[7].n == bVar17);
      auVar18[8] = -(pgVar1->m[8].n == uVar14);
      auVar18[9] = -(pgVar1->m[9].n == uVar15);
      auVar18[10] = -(pgVar1->m[10].n == uVar16);
      auVar18[0xb] = -(pgVar1->m[0xb].n == bVar17);
      auVar18[0xc] = -(pgVar1->m[0xc].n == uVar14);
      auVar18[0xd] = -(pgVar1->m[0xd].n == uVar15);
      auVar18[0xe] = -(pgVar1->m[0xe].n == uVar16);
      auVar18[0xf] = -(bVar7 == bVar17);
      for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
          uVar13 = uVar13 - 1 & uVar13) {
        iVar5 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        if (pSVar8 == *(Symbol **)((long)&ppVar3[uVar9 * 0xf].first + (ulong)(uint)(iVar5 << 4))) {
          return *(Symbol **)((long)&ppVar3[uVar9 * 0xf].second + (ulong)(uint)(iVar5 << 4));
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bVar7) == 0) break;
      lVar10 = uVar9 + uVar12;
      uVar12 = uVar12 + 1;
      uVar9 = lVar10 + 1U & uVar4;
    } while (uVar12 <= uVar4);
    if (((pSVar8 == (Symbol *)0x0) || (pSVar8->kind != CheckerInstanceBody)) ||
       (scope = pSVar8->parentScope, scope == (Scope *)0x0)) {
      return (Symbol *)0x0;
    }
  } while( true );
}

Assistant:

const Symbol* Compilation::getDefaultClocking(const Scope& scope) const {
    auto lookupSym = scope.getContainingInstanceOrChecker();
    if (auto it = defaultClockingMap.find(lookupSym); it != defaultClockingMap.end())
        return it->second;

    // If we're in a checker we can inherit from the containing instance.
    if (lookupSym && lookupSym->kind == SymbolKind::CheckerInstanceBody) {
        if (auto parent = lookupSym->getParentScope())
            return getDefaultClocking(*parent);
    }

    return nullptr;
}